

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_pred_block(CFGStructurizer *this,CFGNode *node)

{
  bool bVar1;
  Vector<CFGNode_*> *this_00;
  reference ppCVar2;
  CFGNode *header;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *local_20;
  CFGNode *pred_node;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  pred_node = node;
  node_local = (CFGNode *)this;
  local_20 = CFGNodePool::create_node(this->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&__range1,&pred_node->name,".pred");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&local_20->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            &__range1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&__range1);
  local_20->forward_post_visit_order = pred_node->forward_post_visit_order;
  local_20->backward_post_visit_order = pred_node->backward_post_visit_order;
  std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
            (&local_20->pred,&pred_node->pred);
  this_00 = &pred_node->headers;
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(this_00);
  header = (CFGNode *)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&header);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    CFGNode::fixup_merge_info_after_branch_rewrite(*ppCVar2,pred_node,local_20);
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::clear
            (&pred_node->headers);
  pred_node->split_merge_block_candidate = local_20;
  if (pred_node == pred_node->immediate_dominator) {
    local_20->immediate_dominator = local_20;
  }
  else {
    local_20->immediate_dominator = pred_node->immediate_dominator;
  }
  local_20->immediate_post_dominator = pred_node;
  pred_node->immediate_dominator = local_20;
  retarget_pred_from(this,local_20,pred_node);
  CFGNode::add_branch(local_20,pred_node);
  if (pred_node == this->entry_block) {
    this->entry_block = local_20;
  }
  (local_20->ir).terminator.type = Branch;
  (local_20->ir).terminator.direct_block = pred_node;
  return local_20;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_pred_block(CFGNode *node)
{
	auto *pred_node = pool.create_node();
	pred_node->name = node->name + ".pred";

	// Fixup visit order later.
	pred_node->forward_post_visit_order = node->forward_post_visit_order;
	pred_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(pred_node->pred, node->pred);
	for (auto *header : node->headers)
		header->fixup_merge_info_after_branch_rewrite(node, pred_node);
	node->headers.clear();

	// When splitting merge scopes, need to consider these pred blocks as well
	// since they might end up with headers.size() >= 2.
	node->split_merge_block_candidate = pred_node;

	// We're replacing entry block.
	if (node == node->immediate_dominator)
		pred_node->immediate_dominator = pred_node;
	else
		pred_node->immediate_dominator = node->immediate_dominator;

	pred_node->immediate_post_dominator = node;
	node->immediate_dominator = pred_node;

	retarget_pred_from(pred_node, node);

	pred_node->add_branch(node);

	if (node == entry_block)
		entry_block = pred_node;

	pred_node->ir.terminator.type = Terminator::Type::Branch;
	pred_node->ir.terminator.direct_block = node;

	return pred_node;
}